

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall
google::protobuf::DynamicMessageFactory::DynamicMessageFactory
          (DynamicMessageFactory *this,DescriptorPool *pool)

{
  size_type in_RSI;
  pointer in_RDI;
  size_type *this_00;
  
  MessageFactory::MessageFactory((MessageFactory *)in_RDI);
  (in_RDI->map_)._M_h._M_buckets = (__buckets_ptr)&PTR__DynamicMessageFactory_0096b990;
  (in_RDI->map_)._M_h._M_bucket_count = in_RSI;
  *(undefined1 *)&(in_RDI->map_)._M_h._M_before_begin._M_nxt = 0;
  this_00 = &(in_RDI->map_)._M_h._M_element_count;
  operator_new(0x38);
  PrototypeMap::PrototypeMap((PrototypeMap *)0x561b6b);
  std::
  unique_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap,std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>>
  ::unique_ptr<std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>,void>
            ((unique_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
              *)this_00,in_RDI);
  internal::WrappedMutex::WrappedMutex((WrappedMutex *)0x561b87);
  return;
}

Assistant:

DynamicMessageFactory::DynamicMessageFactory(const DescriptorPool* pool)
    : pool_(pool),
      delegate_to_generated_factory_(false),
      prototypes_(new PrototypeMap) {}